

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Node * __thiscall anon_unknown.dwarf_4f39de::Db::parseTemplateParam(Db *this)

{
  char *pcVar1;
  ForwardTemplateReference **__src;
  bool bVar2;
  char *pcVar3;
  NameType *pNVar4;
  ForwardTemplateReference *pFVar5;
  ForwardTemplateReference **__dest;
  Node **ppNVar6;
  ForwardTemplateReference **ppFVar7;
  ulong Index;
  size_t __n;
  size_t local_38;
  
  pcVar3 = this->First;
  if ((pcVar3 != this->Last) && (*pcVar3 == 'T')) {
    pcVar1 = pcVar3 + 1;
    this->First = pcVar1;
    local_38 = 0;
    if ((pcVar1 == this->Last) || (*pcVar1 != '_')) {
      bVar2 = parsePositiveInteger(this,&local_38);
      if (bVar2) {
        return (Node *)0x0;
      }
      pcVar3 = this->First;
      if (pcVar3 == this->Last) {
        return (Node *)0x0;
      }
      if (*pcVar3 != '_') {
        return (Node *)0x0;
      }
      Index = local_38 + 1;
      pcVar3 = pcVar3 + 1;
    }
    else {
      pcVar3 = pcVar3 + 2;
      Index = 0;
    }
    this->First = pcVar3;
    if (this->ParsingLambdaParams == true) {
      pNVar4 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[5]>
                         ((Db *)this,(char (*) [5])"auto");
      return &pNVar4->super_Node;
    }
    if (this->PermitForwardTemplateReferences == true) {
      pFVar5 = (ForwardTemplateReference *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
      (pFVar5->super_Node).K = KForwardTemplateReference;
      (pFVar5->super_Node).RHSComponentCache = Unknown;
      (pFVar5->super_Node).ArrayCache = Unknown;
      (pFVar5->super_Node).FunctionCache = Unknown;
      (pFVar5->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00241728;
      pFVar5->Index = Index;
      pFVar5->Ref = (Node *)0x0;
      pFVar5->Printing = false;
      ppFVar7 = (this->ForwardTemplateRefs).Last;
      if (ppFVar7 == (this->ForwardTemplateRefs).Cap) {
        __src = (this->ForwardTemplateRefs).First;
        __n = (long)ppFVar7 - (long)__src;
        if (__src == (this->ForwardTemplateRefs).Inline) {
          __dest = (ForwardTemplateReference **)malloc(__n * 2);
          if (__dest == (ForwardTemplateReference **)0x0) goto LAB_001bff4e;
          if (ppFVar7 != __src) {
            memmove(__dest,__src,__n);
          }
          (this->ForwardTemplateRefs).First = __dest;
        }
        else {
          __dest = (ForwardTemplateReference **)realloc(__src,__n * 2);
          (this->ForwardTemplateRefs).First = __dest;
          if (__dest == (ForwardTemplateReference **)0x0) {
LAB_001bff4e:
            std::terminate();
          }
        }
        ppFVar7 = (ForwardTemplateReference **)((long)__dest + __n);
        (this->ForwardTemplateRefs).Cap = __dest + ((long)__n >> 2);
      }
      (this->ForwardTemplateRefs).Last = ppFVar7 + 1;
      *ppFVar7 = pFVar5;
      ppFVar7 = (this->ForwardTemplateRefs).Last;
      if (ppFVar7 == (this->ForwardTemplateRefs).First) {
        __assert_fail("Last != First && \"Calling back() on empty vector!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Demangle/ItaniumDemangle.cpp"
                      ,0x78a,
                      "T &(anonymous namespace)::PODSmallVector<(anonymous namespace)::ForwardTemplateReference *, 4>::back() [T = (anonymous namespace)::ForwardTemplateReference *, N = 4]"
                     );
      }
      return &ppFVar7[-1]->super_Node;
    }
    if (Index < (ulong)((long)(this->TemplateParams).Last - (long)(this->TemplateParams).First >> 3)
       ) {
      ppNVar6 = PODSmallVector<(anonymous_namespace)::Node_*,_8UL>::operator[]
                          (&this->TemplateParams,Index);
      return *ppNVar6;
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }